

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

CWalletTx * __thiscall
wallet::CWallet::AddToWallet
          (CWallet *this,CTransactionRef *tx,TxState *state,UpdateWalletTxFn *update_wtx,
          bool fFlushOnClose,bool rescanning_old_block)

{
  initializer_list<wallet::CWalletTx_*> __l;
  bool bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint256 *puVar6;
  reference ppVar7;
  int64_t iVar8;
  char *pcVar9;
  char *pcVar10;
  size_type sVar11;
  pointer ppVar12;
  TxStateConfirmed *pTVar13;
  int extraout_EDX;
  int extraout_EDX_00;
  int __c;
  variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
  *in_RDX;
  CWalletTx *__s;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_bool>
  pVar14;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  pVar15;
  TxStateConfirmed *conf;
  uint i;
  CWalletTx *desc_tx;
  bool fUpdated;
  bool fInsertedNew;
  CWalletTx *wtx;
  COutPoint *op;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range2;
  thread t;
  iterator wit;
  const_iterator it;
  pair<std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  range;
  TxStateInactive inactive_state;
  vector<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_> txs;
  const_iterator __end2;
  const_iterator __begin2;
  WalletBatch batch;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_bool>
  ret;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock22;
  string strCmd;
  COutPoint outpoint;
  set<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
  tx_destinations;
  uint256 hash;
  undefined4 in_stack_fffffffffffff9f8;
  ChangeType in_stack_fffffffffffff9fc;
  key_type *in_stack_fffffffffffffa00;
  CWallet *in_stack_fffffffffffffa08;
  function<bool_(wallet::CWalletTx_&,_bool)> *in_stack_fffffffffffffa10;
  CWallet *in_stack_fffffffffffffa18;
  string *substitute;
  CWallet *in_stack_fffffffffffffa20;
  CWallet *in_stack_fffffffffffffa28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa30;
  CWallet *in_stack_fffffffffffffa38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa50;
  CWallet *in_stack_fffffffffffffa58;
  undefined7 in_stack_fffffffffffffa60;
  undefined1 in_stack_fffffffffffffa67;
  CWallet *in_stack_fffffffffffffa68;
  undefined8 in_stack_fffffffffffffa70;
  undefined1 rescanning_old_block_00;
  CWalletTx *in_stack_fffffffffffffa78;
  CWallet *in_stack_fffffffffffffa80;
  ConstevalFormatString<4U> in_stack_fffffffffffffa88;
  bool local_4e1;
  uint local_44c;
  bool local_42a;
  CWalletTx *local_3d0;
  undefined1 local_3c0;
  undefined1 local_3bf;
  undefined1 local_3be;
  undefined1 local_3bd;
  undefined1 local_3bc;
  undefined1 local_3bb;
  undefined1 local_3ba [2];
  char *local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> local_3a0;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> local_398;
  undefined8 local_390;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  local_388;
  undefined8 local_378;
  CWalletTx *local_338;
  pair<long,_wallet::CWalletTx_*> local_330;
  _Base_ptr local_320;
  _Base_ptr local_318;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> local_310;
  undefined1 local_308;
  undefined8 local_2e8;
  CTxIn *local_2e0;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> local_2c8;
  byte local_2c0;
  CWalletTx *local_a0;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffa38,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffa30,
             (char *)in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,
             (int)((ulong)in_stack_fffffffffffffa18 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffa18 >> 0x18,0));
  GetDatabase(in_stack_fffffffffffffa08);
  WalletBatch::WalletBatch
            ((WalletBatch *)in_stack_fffffffffffffa08,(WalletDatabase *)in_stack_fffffffffffffa00,
             SUB41(in_stack_fffffffffffff9fc >> 0x18,0));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  CTransaction::GetHash
            ((CTransaction *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  puVar6 = transaction_identifier::operator_cast_to_uint256_
                     ((transaction_identifier<false> *)
                      CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  local_28 = *(undefined8 *)(puVar6->super_base_blob<256U>).m_data._M_elems;
  uStack_20 = *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 8);
  local_18 = *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 0x10);
  uStack_10 = *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 0x18);
  bVar1 = IsWalletFlagSet(in_stack_fffffffffffffa08,(uint64_t)in_stack_fffffffffffffa00);
  rescanning_old_block_00 = (undefined1)((ulong)in_stack_fffffffffffffa70 >> 0x38);
  if (bVar1) {
    std::
    set<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
    ::set((set<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
           *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    local_2e0 = (CTxIn *)std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
                                   ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                                    in_stack_fffffffffffffa00);
    local_2e8 = std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                          ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffa00);
    while( true ) {
      bVar1 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                          *)in_stack_fffffffffffffa08,
                         (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                          *)in_stack_fffffffffffffa00);
      rescanning_old_block_00 = (undefined1)((ulong)in_stack_fffffffffffffa70 >> 0x38);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      transaction_identifier::operator_cast_to_uint256_
                ((transaction_identifier<false> *)
                 CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      SetSpentKeyState(in_stack_fffffffffffffa68,
                       (WalletBatch *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),
                       (uint256 *)in_stack_fffffffffffffa58,
                       (uint)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                       SUB81((ulong)in_stack_fffffffffffffa50 >> 0x18,0),
                       (set<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                        *)in_stack_fffffffffffffa48);
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                 CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    }
    MarkDestinationsDirty
              (in_stack_fffffffffffffa58,
               (set<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                *)in_stack_fffffffffffffa50);
    std::
    set<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
    ::~set((set<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
            *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  }
  std::forward_as_tuple<uint256&>((uint256 *)in_stack_fffffffffffffa00);
  std::
  forward_as_tuple<std::shared_ptr<CTransaction_const>&,std::variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>const&>
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffa00,
             (variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  __s = (CWalletTx *)&std::piecewise_construct;
  pVar14 = std::
           unordered_map<uint256,wallet::CWalletTx,SaltedTxidHasher,std::equal_to<uint256>,std::allocator<std::pair<uint256_const,wallet::CWalletTx>>>
           ::
           emplace<std::piecewise_construct_t_const&,std::tuple<uint256&>,std::tuple<std::shared_ptr<CTransaction_const>&,std::variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>const&>>
                     ((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
                       *)in_stack_fffffffffffffa18,
                      (piecewise_construct_t *)in_stack_fffffffffffffa10,
                      (tuple<uint256_&> *)in_stack_fffffffffffffa08,
                      (tuple<std::shared_ptr<const_CTransaction>_&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_&>
                       *)in_stack_fffffffffffffa00);
  local_310._M_cur =
       (__node_type *)
       pVar14.first.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
       _M_cur;
  local_308 = pVar14.second;
  local_2c8._M_cur = local_310._M_cur;
  local_2c0 = local_308;
  ppVar7 = std::__detail::_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::
           operator*((_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
                     CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  local_3d0 = &ppVar7->second;
  bVar2 = local_2c0 & 1;
  bVar1 = std::function::operator_cast_to_bool
                    ((function<bool_(wallet::CWalletTx_&,_bool)> *)
                     CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  local_4e1 = false;
  iVar4 = extraout_EDX;
  if (bVar1) {
    __s = local_3d0;
    local_4e1 = std::function<bool_(wallet::CWalletTx_&,_bool)>::operator()
                          (in_stack_fffffffffffffa10,(CWalletTx *)in_stack_fffffffffffffa08,
                           SUB81((ulong)in_stack_fffffffffffffa18 >> 0x38,0));
    iVar4 = extraout_EDX_00;
  }
  local_42a = local_4e1;
  if (bVar2 == 0) {
    pcVar9 = std::
             variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
             ::index(in_RDX,(char *)__s,iVar4);
    pcVar10 = std::
              variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              ::index(&(ppVar7->second).m_state,(char *)__s,__c);
    if (pcVar9 == pcVar10) {
      iVar4 = TxStateSerializedIndex((TxState *)in_stack_fffffffffffffa00);
      iVar5 = TxStateSerializedIndex((TxState *)in_stack_fffffffffffffa00);
      if (iVar4 != iVar5) {
        __assert_fail("TxStateSerializedIndex(wtx.m_state) == TxStateSerializedIndex(state)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                      ,0x454,
                      "CWalletTx *wallet::CWallet::AddToWallet(CTransactionRef, const TxState &, const UpdateWalletTxFn &, bool, bool)"
                     );
      }
      TxStateSerializedBlockHash((TxState *)in_stack_fffffffffffffa00);
      TxStateSerializedBlockHash((TxState *)in_stack_fffffffffffffa00);
      bVar1 = ::operator==((base_blob<256U> *)in_stack_fffffffffffffa08,
                           (base_blob<256U> *)in_stack_fffffffffffffa00);
      if (!bVar1) {
        __assert_fail("TxStateSerializedBlockHash(wtx.m_state) == TxStateSerializedBlockHash(state)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                      ,0x455,
                      "CWalletTx *wallet::CWallet::AddToWallet(CTransactionRef, const TxState &, const UpdateWalletTxFn &, bool, bool)"
                     );
      }
    }
    else {
      memcpy(&(ppVar7->second).m_state,in_RDX,0x29);
      local_42a = true;
    }
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    bVar1 = CTransaction::HasWitness
                      ((CTransaction *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)
                      );
    if (bVar1) {
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      bVar1 = CTransaction::HasWitness
                        ((CTransaction *)
                         CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      if (!bVar1) {
        std::shared_ptr<const_CTransaction>::shared_ptr
                  ((shared_ptr<const_CTransaction> *)
                   CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                   (shared_ptr<const_CTransaction> *)0x16ff3d1);
        CWalletTx::SetTx((CWalletTx *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                         (CTransactionRef *)0x16ff3e6);
        std::shared_ptr<const_CTransaction>::~shared_ptr
                  ((shared_ptr<const_CTransaction> *)
                   CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        local_42a = true;
      }
    }
  }
  else {
    iVar8 = GetTime();
    (ppVar7->second).nTimeReceived = (uint)iVar8;
    iVar8 = IncOrderPosNext(in_stack_fffffffffffffa38,(WalletBatch *)in_stack_fffffffffffffa30);
    (ppVar7->second).nOrderPos = iVar8;
    local_338 = local_3d0;
    local_330 = std::make_pair<long&,wallet::CWalletTx*>
                          ((long *)in_stack_fffffffffffffa08,(CWalletTx **)in_stack_fffffffffffffa00
                          );
    local_320 = (_Base_ptr)
                std::
                multimap<long,wallet::CWalletTx*,std::less<long>,std::allocator<std::pair<long_const,wallet::CWalletTx*>>>
                ::insert<std::pair<long,wallet::CWalletTx*>>
                          ((multimap<long,_wallet::CWalletTx_*,_std::less<long>,_std::allocator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
                            *)in_stack_fffffffffffffa00,
                           (pair<long,_wallet::CWalletTx_*> *)
                           CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    std::_Rb_tree_const_iterator<std::pair<const_long,_wallet::CWalletTx_*>_>::
    _Rb_tree_const_iterator
              ((_Rb_tree_const_iterator<std::pair<const_long,_wallet::CWalletTx_*>_> *)
               CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),(iterator *)0x16ff144);
    (ppVar7->second).m_it_wtxOrdered._M_node = local_318;
    uVar3 = ComputeTimeSmart(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                             (bool)rescanning_old_block_00);
    (ppVar7->second).nTimeSmart = uVar3;
    AddToSpends(in_stack_fffffffffffffa28,(CWalletTx *)in_stack_fffffffffffffa20,
                (WalletBatch *)in_stack_fffffffffffffa18);
    CWalletTx::GetTxTime((CWalletTx *)in_stack_fffffffffffffa18);
    MaybeUpdateBirthTime(in_stack_fffffffffffffa20,(int64_t)in_stack_fffffffffffffa18);
  }
  bVar1 = CWalletTx::IsCoinBase
                    ((CWalletTx *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  if (bVar1) {
    bVar1 = CWalletTx::isInactive
                      ((CWalletTx *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    if (bVar1) {
      local_a0 = local_3d0;
      std::allocator<wallet::CWalletTx_*>::allocator
                ((allocator<wallet::CWalletTx_*> *)
                 CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      __l._M_len = (size_type)in_stack_fffffffffffffa48;
      __l._M_array = (iterator)in_stack_fffffffffffffa40;
      std::vector<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>::vector
                ((vector<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_> *)
                 in_stack_fffffffffffffa38,__l,(allocator_type *)in_stack_fffffffffffffa30);
      std::allocator<wallet::CWalletTx_*>::~allocator
                ((allocator<wallet::CWalletTx_*> *)
                 CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      TxStateInactive::TxStateInactive
                ((TxStateInactive *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                 false);
      while( true ) {
        bVar1 = std::vector<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>::empty
                          ((vector<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_> *)
                           in_stack_fffffffffffffa08);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        std::vector<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>::back
                  ((vector<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_> *)
                   CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        std::vector<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>::pop_back
                  ((vector<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_> *)
                   CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        std::
        variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
        ::operator=((variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                     *)in_stack_fffffffffffffa18,(TxStateInactive *)in_stack_fffffffffffffa10);
        CWalletTx::MarkDirty
                  ((CWalletTx *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
        WalletBatch::WriteTx
                  ((WalletBatch *)in_stack_fffffffffffffa28,(CWalletTx *)in_stack_fffffffffffffa20);
        MarkInputsDirty(in_stack_fffffffffffffa18,(CTransactionRef *)in_stack_fffffffffffffa10);
        local_44c = 0;
        while( true ) {
          std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
          sVar11 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                             ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                              CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
          if (sVar11 <= local_44c) break;
          in_stack_fffffffffffffa88.fmt =
               (char *)CWalletTx::GetHash((CWalletTx *)
                                          CONCAT44(in_stack_fffffffffffff9fc,
                                                   in_stack_fffffffffffff9f8));
          COutPoint::COutPoint
                    ((COutPoint *)in_stack_fffffffffffffa08,&in_stack_fffffffffffffa00->hash,
                     in_stack_fffffffffffff9fc);
          pVar15 = std::
                   unordered_multimap<COutPoint,_uint256,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<std::pair<const_COutPoint,_uint256>_>_>
                   ::equal_range((unordered_multimap<COutPoint,_uint256,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<std::pair<const_COutPoint,_uint256>_>_>
                                  *)in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
          local_388 = pVar15;
          std::
          pair<std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
          ::
          pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_true>
                    ((pair<std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
                      *)in_stack_fffffffffffffa08,
                     (pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
                      *)in_stack_fffffffffffffa00);
          local_390 = local_378;
          while( true ) {
            bVar1 = std::__detail::operator==
                              ((_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> *)
                               in_stack_fffffffffffffa08,
                               (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> *)
                               in_stack_fffffffffffffa00);
            if (((bVar1 ^ 0xffU) & 1) == 0) break;
            std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>::
            operator->((_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> *)
                       CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
            local_398._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
                 ::find((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
                         *)in_stack_fffffffffffffa00,
                        (key_type *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
            local_3a0._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
                 ::end((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
                        *)in_stack_fffffffffffffa00);
            bVar1 = std::__detail::operator==
                              ((_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                *)in_stack_fffffffffffffa08,
                               (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                *)in_stack_fffffffffffffa00);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              ppVar12 = std::__detail::
                        _Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::
                        operator->((_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>
                                    *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8))
              ;
              local_3b0._8_8_ = &ppVar12->second;
              std::vector<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>::push_back
                        ((vector<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_> *)
                         CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                         (value_type *)0x16ff76f);
            }
            std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>::
            operator++((_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> *)
                       CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
          }
          local_44c = local_44c + 1;
        }
      }
      std::vector<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>::~vector
                ((vector<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_> *)
                 in_stack_fffffffffffffa08);
    }
  }
  base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffa00);
  local_3b8 = "";
  local_3b0._M_allocated_capacity = (size_type)"";
  if (bVar2 != 0) {
    local_3b0._M_allocated_capacity = (size_type)"new";
  }
  if (local_42a != false) {
    local_3b8 = "update";
  }
  TxStateString<std::variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>>
            ((variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  WalletLogPrintf<std::__cxx11::string,char_const*,char_const*,std::__cxx11::string>
            (in_stack_fffffffffffffa58,in_stack_fffffffffffffa88,in_stack_fffffffffffffa50,
             (char **)in_stack_fffffffffffffa48,(char **)in_stack_fffffffffffffa40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa38);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  if ((bVar2 != 0) || (local_42a != false)) {
    bVar1 = WalletBatch::WriteTx
                      ((WalletBatch *)in_stack_fffffffffffffa28,
                       (CWalletTx *)in_stack_fffffffffffffa20);
    if (!bVar1) {
      local_3d0 = (CWalletTx *)0x0;
      goto LAB_01700166;
    }
  }
  CWalletTx::MarkDirty((CWalletTx *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  boost::signals2::
  signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
  ::operator()((signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
                *)in_stack_fffffffffffffa08,(uint256 *)in_stack_fffffffffffffa00,
               in_stack_fffffffffffff9fc);
  std::__cxx11::string::string
            (in_stack_fffffffffffffa40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa38);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa48,(char *)in_stack_fffffffffffffa40,
               (allocator<char> *)in_stack_fffffffffffffa38);
    base_blob<256u>::GetHex_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffa10);
    util::ReplaceAll((string *)in_stack_fffffffffffffa28,(string *)in_stack_fffffffffffffa20,
                     (string *)in_stack_fffffffffffffa18);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    std::allocator<char>::~allocator((allocator<char> *)(local_3ba + 1));
    pTVar13 = CWalletTx::state<wallet::TxStateConfirmed>
                        ((CWalletTx *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8))
    ;
    if (pTVar13 == (TxStateConfirmed *)0x0) {
      in_stack_fffffffffffffa38 = (CWallet *)&local_3bc;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa48,(char *)in_stack_fffffffffffffa40,
                 (allocator<char> *)in_stack_fffffffffffffa38);
      in_stack_fffffffffffffa30 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3bd;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa48,(char *)in_stack_fffffffffffffa40,
                 (allocator<char> *)in_stack_fffffffffffffa38);
      util::ReplaceAll((string *)in_stack_fffffffffffffa28,(string *)in_stack_fffffffffffffa20,
                       (string *)in_stack_fffffffffffffa18);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      std::allocator<char>::~allocator((allocator<char> *)&local_3bd);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      std::allocator<char>::~allocator((allocator<char> *)&local_3bc);
      in_stack_fffffffffffffa28 = (CWallet *)&local_3be;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa48,(char *)in_stack_fffffffffffffa40,
                 (allocator<char> *)in_stack_fffffffffffffa38);
      in_stack_fffffffffffffa20 = (CWallet *)&local_3bf;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa48,(char *)in_stack_fffffffffffffa40,
                 (allocator<char> *)in_stack_fffffffffffffa38);
      util::ReplaceAll((string *)in_stack_fffffffffffffa28,(string *)in_stack_fffffffffffffa20,
                       (string *)in_stack_fffffffffffffa18);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      std::allocator<char>::~allocator((allocator<char> *)&local_3bf);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      std::allocator<char>::~allocator((allocator<char> *)&local_3be);
    }
    else {
      in_stack_fffffffffffffa48 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3ba;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa48,(char *)in_stack_fffffffffffffa40,
                 (allocator<char> *)in_stack_fffffffffffffa38);
      base_blob<256u>::GetHex_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffa10);
      util::ReplaceAll((string *)in_stack_fffffffffffffa28,(string *)in_stack_fffffffffffffa20,
                       (string *)in_stack_fffffffffffffa18);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      std::allocator<char>::~allocator((allocator<char> *)local_3ba);
      in_stack_fffffffffffffa40 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3bb;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa48,(char *)in_stack_fffffffffffffa40,
                 (allocator<char> *)in_stack_fffffffffffffa38);
      util::ToString<int>((int *)in_stack_fffffffffffffa30);
      util::ReplaceAll((string *)in_stack_fffffffffffffa28,(string *)in_stack_fffffffffffffa20,
                       (string *)in_stack_fffffffffffffa18);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
      std::allocator<char>::~allocator((allocator<char> *)&local_3bb);
    }
    substitute = (string *)&local_3c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa48,(char *)in_stack_fffffffffffffa40,
               (allocator<char> *)in_stack_fffffffffffffa38);
    GetName_abi_cxx11_((CWallet *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    ShellEscape((string *)in_stack_fffffffffffffa28);
    util::ReplaceAll((string *)in_stack_fffffffffffffa28,(string *)in_stack_fffffffffffffa20,
                     substitute);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    std::allocator<char>::~allocator((allocator<char> *)&local_3c0);
    std::thread::thread<void(&)(std::__cxx11::string_const&),std::__cxx11::string&,void>
              ((thread *)in_stack_fffffffffffffa40,
               (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)
               in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
    std::thread::detach();
    std::thread::~thread((thread *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
LAB_01700166:
  WalletBatch::~WalletBatch
            ((WalletBatch *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_3d0;
  }
  __stack_chk_fail();
}

Assistant:

CWalletTx* CWallet::AddToWallet(CTransactionRef tx, const TxState& state, const UpdateWalletTxFn& update_wtx, bool fFlushOnClose, bool rescanning_old_block)
{
    LOCK(cs_wallet);

    WalletBatch batch(GetDatabase(), fFlushOnClose);

    uint256 hash = tx->GetHash();

    if (IsWalletFlagSet(WALLET_FLAG_AVOID_REUSE)) {
        // Mark used destinations
        std::set<CTxDestination> tx_destinations;

        for (const CTxIn& txin : tx->vin) {
            const COutPoint& op = txin.prevout;
            SetSpentKeyState(batch, op.hash, op.n, true, tx_destinations);
        }

        MarkDestinationsDirty(tx_destinations);
    }

    // Inserts only if not already there, returns tx inserted or tx found
    auto ret = mapWallet.emplace(std::piecewise_construct, std::forward_as_tuple(hash), std::forward_as_tuple(tx, state));
    CWalletTx& wtx = (*ret.first).second;
    bool fInsertedNew = ret.second;
    bool fUpdated = update_wtx && update_wtx(wtx, fInsertedNew);
    if (fInsertedNew) {
        wtx.nTimeReceived = GetTime();
        wtx.nOrderPos = IncOrderPosNext(&batch);
        wtx.m_it_wtxOrdered = wtxOrdered.insert(std::make_pair(wtx.nOrderPos, &wtx));
        wtx.nTimeSmart = ComputeTimeSmart(wtx, rescanning_old_block);
        AddToSpends(wtx, &batch);

        // Update birth time when tx time is older than it.
        MaybeUpdateBirthTime(wtx.GetTxTime());
    }

    if (!fInsertedNew)
    {
        if (state.index() != wtx.m_state.index()) {
            wtx.m_state = state;
            fUpdated = true;
        } else {
            assert(TxStateSerializedIndex(wtx.m_state) == TxStateSerializedIndex(state));
            assert(TxStateSerializedBlockHash(wtx.m_state) == TxStateSerializedBlockHash(state));
        }
        // If we have a witness-stripped version of this transaction, and we
        // see a new version with a witness, then we must be upgrading a pre-segwit
        // wallet.  Store the new version of the transaction with the witness,
        // as the stripped-version must be invalid.
        // TODO: Store all versions of the transaction, instead of just one.
        if (tx->HasWitness() && !wtx.tx->HasWitness()) {
            wtx.SetTx(tx);
            fUpdated = true;
        }
    }

    // Mark inactive coinbase transactions and their descendants as abandoned
    if (wtx.IsCoinBase() && wtx.isInactive()) {
        std::vector<CWalletTx*> txs{&wtx};

        TxStateInactive inactive_state = TxStateInactive{/*abandoned=*/true};

        while (!txs.empty()) {
            CWalletTx* desc_tx = txs.back();
            txs.pop_back();
            desc_tx->m_state = inactive_state;
            // Break caches since we have changed the state
            desc_tx->MarkDirty();
            batch.WriteTx(*desc_tx);
            MarkInputsDirty(desc_tx->tx);
            for (unsigned int i = 0; i < desc_tx->tx->vout.size(); ++i) {
                COutPoint outpoint(desc_tx->GetHash(), i);
                std::pair<TxSpends::const_iterator, TxSpends::const_iterator> range = mapTxSpends.equal_range(outpoint);
                for (TxSpends::const_iterator it = range.first; it != range.second; ++it) {
                    const auto wit = mapWallet.find(it->second);
                    if (wit != mapWallet.end()) {
                        txs.push_back(&wit->second);
                    }
                }
            }
        }
    }

    //// debug print
    WalletLogPrintf("AddToWallet %s  %s%s %s\n", hash.ToString(), (fInsertedNew ? "new" : ""), (fUpdated ? "update" : ""), TxStateString(state));

    // Write to disk
    if (fInsertedNew || fUpdated)
        if (!batch.WriteTx(wtx))
            return nullptr;

    // Break debit/credit balance caches:
    wtx.MarkDirty();

    // Notify UI of new or updated transaction
    NotifyTransactionChanged(hash, fInsertedNew ? CT_NEW : CT_UPDATED);

#if HAVE_SYSTEM
    // notify an external script when a wallet transaction comes in or is updated
    std::string strCmd = m_notify_tx_changed_script;

    if (!strCmd.empty())
    {
        ReplaceAll(strCmd, "%s", hash.GetHex());
        if (auto* conf = wtx.state<TxStateConfirmed>())
        {
            ReplaceAll(strCmd, "%b", conf->confirmed_block_hash.GetHex());
            ReplaceAll(strCmd, "%h", ToString(conf->confirmed_block_height));
        } else {
            ReplaceAll(strCmd, "%b", "unconfirmed");
            ReplaceAll(strCmd, "%h", "-1");
        }
#ifndef WIN32
        // Substituting the wallet name isn't currently supported on windows
        // because windows shell escaping has not been implemented yet:
        // https://github.com/bitcoin/bitcoin/pull/13339#issuecomment-537384875
        // A few ways it could be implemented in the future are described in:
        // https://github.com/bitcoin/bitcoin/pull/13339#issuecomment-461288094
        ReplaceAll(strCmd, "%w", ShellEscape(GetName()));
#endif
        std::thread t(runCommand, strCmd);
        t.detach(); // thread runs free
    }
#endif

    return &wtx;
}